

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ushort uVar1;
  int iVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  unsigned_short *__src;
  ImVec2 IVar5;
  int iVar6;
  uint uVar7;
  ImDrawVert *pIVar8;
  ulong uVar9;
  unsigned_short *__dest;
  ulong uVar10;
  int rhs_size;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ImDrawVert *local_60;
  
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  iVar6 = this->CmdListsCount;
  if (0 < iVar6) {
    iVar2 = 0;
    local_60 = (ImDrawVert *)0x0;
    uVar12 = 0;
    lVar13 = 0;
    do {
      pIVar3 = this->CmdLists[lVar13];
      uVar11 = (pIVar3->IdxBuffer).Size;
      if (uVar11 != 0) {
        uVar7 = uVar11;
        if ((int)uVar12 < (int)uVar11) {
          if (uVar12 == 0) {
            uVar12 = 8;
          }
          else {
            uVar12 = uVar12 + (int)uVar12 / 2;
          }
          if ((int)uVar12 <= (int)uVar11) {
            uVar12 = uVar11;
          }
          pIVar8 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar12 * 0x14);
          if (local_60 != (ImDrawVert *)0x0) {
            memcpy(pIVar8,local_60,(long)iVar2 * 0x14);
            ImGui::MemFree(local_60);
          }
          local_60 = pIVar8;
          uVar7 = (pIVar3->IdxBuffer).Size;
        }
        if (0 < (int)uVar7) {
          uVar9 = 0;
          if (0 < (int)uVar11) {
            uVar9 = (ulong)uVar11;
          }
          uVar10 = 0;
          pIVar8 = local_60;
          do {
            uVar1 = (pIVar3->IdxBuffer).Data[uVar10];
            if (((pIVar3->VtxBuffer).Size <= (int)(uint)uVar1) || (uVar9 == uVar10)) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5c2,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar4 = (pIVar3->VtxBuffer).Data;
            pIVar8->col = pIVar4[uVar1].col;
            pIVar4 = pIVar4 + uVar1;
            IVar5 = pIVar4->uv;
            pIVar8->pos = pIVar4->pos;
            pIVar8->uv = IVar5;
            uVar10 = uVar10 + 1;
            pIVar8 = pIVar8 + 1;
          } while ((long)uVar10 < (long)(pIVar3->IdxBuffer).Size);
        }
        iVar2 = (pIVar3->VtxBuffer).Size;
        (pIVar3->VtxBuffer).Size = uVar11;
        uVar7 = (pIVar3->VtxBuffer).Capacity;
        (pIVar3->VtxBuffer).Capacity = uVar12;
        pIVar8 = (pIVar3->VtxBuffer).Data;
        (pIVar3->VtxBuffer).Data = local_60;
        if ((pIVar3->IdxBuffer).Capacity < 0) {
          __dest = (unsigned_short *)ImGui::MemAlloc(0);
          __src = (pIVar3->IdxBuffer).Data;
          if (__src != (unsigned_short *)0x0) {
            memcpy(__dest,__src,(long)(pIVar3->IdxBuffer).Size * 2);
            ImGui::MemFree((pIVar3->IdxBuffer).Data);
          }
          (pIVar3->IdxBuffer).Data = __dest;
          (pIVar3->IdxBuffer).Capacity = 0;
          uVar11 = (pIVar3->VtxBuffer).Size;
        }
        (pIVar3->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + uVar11;
        iVar6 = this->CmdListsCount;
        uVar12 = uVar7;
        local_60 = pIVar8;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar6);
    if (local_60 != (ImDrawVert *)0x0) {
      ImGui::MemFree(local_60);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}